

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

PgHdr1 * pcache1FetchStage2(PCache1 *pCache,uint iKey,int createFlag)

{
  uint uVar1;
  PGroup *pPVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  u64 uVar7;
  ulong uVar8;
  long lVar9;
  u64 n;
  uint uVar10;
  PgHdr1 *pPVar11;
  
  pPVar2 = pCache->pGroup;
  uVar5 = pCache->nPage;
  if (createFlag == 1) {
    uVar1 = pCache->nRecyclable;
    uVar10 = uVar5 - uVar1;
    if (pPVar2->mxPinned <= uVar10) {
      return (PgHdr1 *)0x0;
    }
    if (pCache->n90pct <= uVar10) {
      return (PgHdr1 *)0x0;
    }
    iVar3 = pcache1UnderMemoryPressure(pCache);
    if (iVar3 != 0 && uVar1 < uVar10) {
      return (PgHdr1 *)0x0;
    }
  }
  if (pCache->nHash <= uVar5) {
    pcache1ResizeHash(pCache);
  }
  if (((pCache->bPurgeable != 0) && (pPVar11 = (pPVar2->lru).pLruPrev, pPVar11->isAnchor == 0)) &&
     ((pCache->nMax <= pCache->nPage + 1 || (iVar3 = pcache1UnderMemoryPressure(pCache), iVar3 != 0)
      ))) {
    pcache1RemoveFromHash(pPVar11,0);
    pcache1PinPage(pPVar11);
    if (pPVar11->pCache->szAlloc == pCache->szAlloc) {
      pPVar2->nPurgeable = pPVar2->nPurgeable + (pCache->bPurgeable - pPVar11->pCache->bPurgeable);
      goto LAB_00188b2c;
    }
    pcache1FreePage(pPVar11);
  }
  pPVar11 = pCache->pFree;
  if (pPVar11 == (PgHdr1 *)0x0) {
    if (((pCache->nPage == 0) && (pcache1_g.nInitPage != 0)) && (2 < pCache->nMax)) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      if (pcache1_g.nInitPage < 1) {
        uVar7 = (long)pcache1_g.nInitPage * -0x400;
        lVar9 = (long)pCache->szAlloc;
      }
      else {
        lVar9 = (long)pCache->szAlloc;
        uVar7 = (ulong)(uint)pcache1_g.nInitPage * lVar9;
      }
      n = (ulong)pCache->nMax * lVar9;
      if ((long)uVar7 < (long)n) {
        n = uVar7;
      }
      pvVar6 = sqlite3Malloc(n);
      pCache->pBulk = pvVar6;
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pvVar6 == (void *)0x0) {
        pPVar11 = pCache->pFree;
        if (pPVar11 == (PgHdr1 *)0x0) goto LAB_00188ad8;
      }
      else {
        iVar4 = (*sqlite3Config.m.xSize)(pvVar6);
        iVar3 = pCache->szAlloc;
        uVar8 = (long)iVar4 / (long)iVar3 & 0xffffffff;
        lVar9 = (long)pCache->szPage;
        pPVar11 = pCache->pFree;
        do {
          *(void **)((long)pvVar6 + lVar9) = pvVar6;
          *(long *)((long)pvVar6 + lVar9 + 8) = (long)pvVar6 + lVar9 + 0x38;
          *(undefined4 *)((long)pvVar6 + lVar9 + 0x14) = 1;
          *(PgHdr1 **)((long)pvVar6 + lVar9 + 0x18) = pPVar11;
          *(undefined8 *)((long)pvVar6 + lVar9 + 0x30) = 0;
          pPVar11 = (PgHdr1 *)((long)pvVar6 + lVar9);
          pvVar6 = (void *)((long)pvVar6 + (long)iVar3);
          uVar5 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar5;
        } while (uVar5 != 0);
        pPVar11 = (PgHdr1 *)((long)pvVar6 + (lVar9 - iVar3));
      }
      goto LAB_00188abe;
    }
LAB_00188ad8:
    if ((createFlag == 1) && (sqlite3Hooks_0 != (code *)0x0)) {
      (*sqlite3Hooks_0)();
    }
    pvVar6 = pcache1Alloc(pCache->szAlloc);
    iVar3 = pCache->szPage;
    if ((createFlag == 1) && (sqlite3Hooks_1 != (code *)0x0)) {
      (*sqlite3Hooks_1)();
    }
    if (pvVar6 == (void *)0x0) {
      return (PgHdr1 *)0x0;
    }
    pPVar11 = (PgHdr1 *)((long)iVar3 + (long)pvVar6);
    (pPVar11->page).pBuf = pvVar6;
    (pPVar11->page).pExtra = pPVar11 + 1;
    pPVar11->isBulkLocal = 0;
    pPVar11->isAnchor = 0;
  }
  else {
LAB_00188abe:
    pCache->pFree = pPVar11->pNext;
    pPVar11->pNext = (PgHdr1 *)0x0;
  }
  *pCache->pnPurgeable = *pCache->pnPurgeable + 1;
LAB_00188b2c:
  uVar8 = (ulong)iKey % (ulong)pCache->nHash;
  pCache->nPage = pCache->nPage + 1;
  pPVar11->iKey = iKey;
  pPVar11->pNext = pCache->apHash[uVar8];
  pPVar11->pCache = pCache;
  pPVar11->pLruNext = (PgHdr1 *)0x0;
  *(undefined8 *)(pPVar11->page).pExtra = 0;
  pCache->apHash[uVar8] = pPVar11;
  if (pCache->iMaxKey < iKey) {
    pCache->iMaxKey = iKey;
  }
  return pPVar11;
}

Assistant:

static SQLITE_NOINLINE PgHdr1 *pcache1FetchStage2(
  PCache1 *pCache, 
  unsigned int iKey, 
  int createFlag
){
  unsigned int nPinned;
  PGroup *pGroup = pCache->pGroup;
  PgHdr1 *pPage = 0;

  /* Step 3: Abort if createFlag is 1 but the cache is nearly full */
  assert( pCache->nPage >= pCache->nRecyclable );
  nPinned = pCache->nPage - pCache->nRecyclable;
  assert( pGroup->mxPinned == pGroup->nMaxPage + 10 - pGroup->nMinPage );
  assert( pCache->n90pct == pCache->nMax*9/10 );
  if( createFlag==1 && (
        nPinned>=pGroup->mxPinned
     || nPinned>=pCache->n90pct
     || (pcache1UnderMemoryPressure(pCache) && pCache->nRecyclable<nPinned)
  )){
    return 0;
  }

  if( pCache->nPage>=pCache->nHash ) pcache1ResizeHash(pCache);
  assert( pCache->nHash>0 && pCache->apHash );

  /* Step 4. Try to recycle a page. */
  if( pCache->bPurgeable
   && !pGroup->lru.pLruPrev->isAnchor
   && ((pCache->nPage+1>=pCache->nMax) || pcache1UnderMemoryPressure(pCache))
  ){
    PCache1 *pOther;
    pPage = pGroup->lru.pLruPrev;
    assert( PAGE_IS_UNPINNED(pPage) );
    pcache1RemoveFromHash(pPage, 0);
    pcache1PinPage(pPage);
    pOther = pPage->pCache;
    if( pOther->szAlloc != pCache->szAlloc ){
      pcache1FreePage(pPage);
      pPage = 0;
    }else{
      pGroup->nPurgeable -= (pOther->bPurgeable - pCache->bPurgeable);
    }
  }

  /* Step 5. If a usable page buffer has still not been found, 
  ** attempt to allocate a new one. 
  */
  if( !pPage ){
    pPage = pcache1AllocPage(pCache, createFlag==1);
  }

  if( pPage ){
    unsigned int h = iKey % pCache->nHash;
    pCache->nPage++;
    pPage->iKey = iKey;
    pPage->pNext = pCache->apHash[h];
    pPage->pCache = pCache;
    pPage->pLruNext = 0;
    /* pPage->pLruPrev = 0;
    ** No need to clear pLruPrev since it is not accessed when pLruNext==0 */
    *(void **)pPage->page.pExtra = 0;
    pCache->apHash[h] = pPage;
    if( iKey>pCache->iMaxKey ){
      pCache->iMaxKey = iKey;
    }
  }
  return pPage;
}